

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inputparser.cpp
# Opt level: O0

void __thiscall PropertyParser::parseNodeProperty(PropertyParser *this,int type,string *nodeName)

{
  InputError *this_00;
  string local_48 [32];
  Node *local_28;
  Node *node;
  string *nodeName_local;
  PropertyParser *pPStack_10;
  int type_local;
  PropertyParser *this_local;
  
  node = (Node *)nodeName;
  nodeName_local._4_4_ = type;
  pPStack_10 = this;
  local_28 = Network::node((this->super_InputParser).network,nodeName);
  if (local_28 == (Node *)0x0) {
    this_00 = (InputError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string(local_48,(string *)node);
    InputError::InputError(this_00,5,(string *)local_48);
    __cxa_throw(this_00,&InputError::typeinfo,InputError::~InputError);
  }
  switch(nodeName_local._4_4_) {
  case 0xb:
    NodeParser::parseEmitter
              ((NodeParser *)&this->field_0x10,local_28,(this->super_InputParser).network,
               &this->tokens);
    break;
  case 0xc:
    NodeParser::parseDemand
              ((NodeParser *)&this->field_0x10,local_28,(this->super_InputParser).network,
               &this->tokens);
    break;
  case 0x11:
    NodeParser::parseInitQual((NodeParser *)&this->field_0x10,local_28,&this->tokens);
    break;
  case 0x12:
    NodeParser::parseQualSource
              ((NodeParser *)&this->field_0x10,local_28,(this->super_InputParser).network,
               &this->tokens);
    break;
  case 0x13:
    NodeParser::parseTankReact((NodeParser *)&this->field_0x10,local_28,&this->tokens);
    break;
  case 0x14:
    NodeParser::parseTankMixing((NodeParser *)&this->field_0x10,local_28,&this->tokens);
    break;
  case 0x18:
    NodeParser::parseCoords((NodeParser *)&this->field_0x10,local_28,&this->tokens);
  }
  return;
}

Assistant:

void PropertyParser::parseNodeProperty(int type, string& nodeName)
{
    Node* node = network->node(nodeName);
    if ( node == nullptr ) throw InputError(InputError::UNDEFINED_OBJECT, nodeName);
    switch (type)
    {
        case InputReader::EMITTER:
            nodeParser.parseEmitter(node, network, tokens);
            break;
        case InputReader::DEMAND:
            nodeParser.parseDemand(node, network, tokens);
            break;
        case InputReader::COORD:
            nodeParser.parseCoords(node, tokens);
            break;
        case InputReader::QUALITY:
            nodeParser.parseInitQual(node, tokens);
            break;
        case InputReader::SOURCE:
            nodeParser.parseQualSource(node, network, tokens);
            break;
        case InputReader::MIXING:
            nodeParser.parseTankMixing(node, tokens);
            break;
        case InputReader::REACTION:
            nodeParser.parseTankReact(node, tokens);
            break;
    }
}